

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_info(char *buf,size_t size,char *prefix,mbedtls_x509_crt *crt)

{
  char *__maxlen;
  mbedtls_x509_crt *pmVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char local_68 [8];
  char key_size_str [18];
  char *p;
  size_t n;
  mbedtls_x509_crt *pmStack_38;
  int ret;
  mbedtls_x509_crt *crt_local;
  char *prefix_local;
  size_t size_local;
  char *buf_local;
  
  n._4_4_ = 0xffffff92;
  unique0x10000737 = buf;
  p = (char *)size;
  pmStack_38 = crt;
  crt_local = (mbedtls_x509_crt *)prefix;
  prefix_local = (char *)size;
  size_local = (size_t)buf;
  if (crt == (mbedtls_x509_crt *)0x0) {
    iVar2 = snprintf(buf,size,"\nCertificate is uninitialised!\n");
    if ((iVar2 < 0) || (p <= (char *)(long)iVar2)) {
      buf_local._4_4_ = -0x2980;
    }
    else {
      buf_local._4_4_ = (int)prefix_local - ((int)p - iVar2);
    }
  }
  else {
    n._4_4_ = snprintf(buf,size,"%scert. version     : %d\n",prefix,(ulong)(uint)crt->version);
    if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
      buf_local._4_4_ = -0x2980;
    }
    else {
      p = p + -(long)n._4_4_;
      register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
      n._4_4_ = snprintf(register0x00000000,(size_t)p,"%sserial number     : ",crt_local);
      if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
        buf_local._4_4_ = -0x2980;
      }
      else {
        p = p + -(long)n._4_4_;
        register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
        n._4_4_ = mbedtls_x509_serial_gets(register0x00000000,(size_t)p,&pmStack_38->serial);
        if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
          buf_local._4_4_ = -0x2980;
        }
        else {
          p = p + -(long)n._4_4_;
          register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
          n._4_4_ = snprintf(register0x00000000,(size_t)p,"\n%sissuer name       : ",crt_local);
          if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
            buf_local._4_4_ = -0x2980;
          }
          else {
            p = p + -(long)n._4_4_;
            register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
            n._4_4_ = mbedtls_x509_dn_gets(register0x00000000,(size_t)p,&pmStack_38->issuer);
            if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
              buf_local._4_4_ = -0x2980;
            }
            else {
              p = p + -(long)n._4_4_;
              register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
              n._4_4_ = snprintf(register0x00000000,(size_t)p,"\n%ssubject name      : ",crt_local);
              if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                buf_local._4_4_ = -0x2980;
              }
              else {
                p = p + -(long)n._4_4_;
                register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                n._4_4_ = mbedtls_x509_dn_gets(register0x00000000,(size_t)p,&pmStack_38->subject);
                if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                  buf_local._4_4_ = -0x2980;
                }
                else {
                  p = p + -(long)n._4_4_;
                  register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                  n._4_4_ = snprintf(register0x00000000,(size_t)p,
                                     "\n%sissued  on        : %04d-%02d-%02d %02d:%02d:%02d",
                                     crt_local,(ulong)(uint)(pmStack_38->valid_from).year,
                                     (ulong)(uint)(pmStack_38->valid_from).mon,
                                     (pmStack_38->valid_from).day,(pmStack_38->valid_from).hour,
                                     (pmStack_38->valid_from).min,(pmStack_38->valid_from).sec);
                  if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                    buf_local._4_4_ = -0x2980;
                  }
                  else {
                    p = p + -(long)n._4_4_;
                    register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                    n._4_4_ = snprintf(register0x00000000,(size_t)p,
                                       "\n%sexpires on        : %04d-%02d-%02d %02d:%02d:%02d",
                                       crt_local,(ulong)(uint)(pmStack_38->valid_to).year,
                                       (ulong)(uint)(pmStack_38->valid_to).mon,
                                       (pmStack_38->valid_to).day,(pmStack_38->valid_to).hour,
                                       (pmStack_38->valid_to).min,(pmStack_38->valid_to).sec);
                    if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                      buf_local._4_4_ = -0x2980;
                    }
                    else {
                      p = p + -(long)n._4_4_;
                      register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                      n._4_4_ = snprintf(register0x00000000,(size_t)p,"\n%ssigned using      : ",
                                         crt_local);
                      if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                        buf_local._4_4_ = -0x2980;
                      }
                      else {
                        p = p + -(long)n._4_4_;
                        register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                        n._4_4_ = mbedtls_x509_sig_alg_gets
                                            (register0x00000000,(size_t)p,&pmStack_38->sig_oid,
                                             pmStack_38->sig_pk,pmStack_38->sig_md,
                                             pmStack_38->sig_opts);
                        if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                          buf_local._4_4_ = -0x2980;
                        }
                        else {
                          p = p + -(long)n._4_4_;
                          register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                          pcVar3 = mbedtls_pk_get_name(&pmStack_38->pk);
                          n._4_4_ = mbedtls_x509_key_size_helper(local_68,0x12,pcVar3);
                          pmVar1 = crt_local;
                          __maxlen = p;
                          pcVar3 = stack0xffffffffffffffb0;
                          buf_local._4_4_ = n._4_4_;
                          if (n._4_4_ == 0) {
                            sVar4 = mbedtls_pk_get_bitlen(&pmStack_38->pk);
                            n._4_4_ = snprintf(pcVar3,(size_t)__maxlen,"\n%s%-18s: %d bits",pmVar1,
                                               local_68,sVar4 & 0xffffffff);
                            if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                              buf_local._4_4_ = -0x2980;
                            }
                            else {
                              p = p + -(long)n._4_4_;
                              register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                              if ((pmStack_38->ext_types & 0x100U) != 0) {
                                pcVar3 = "false";
                                if (pmStack_38->ca_istrue != 0) {
                                  pcVar3 = "true";
                                }
                                n._4_4_ = snprintf(register0x00000000,(size_t)p,
                                                   "\n%sbasic constraints : CA=%s",crt_local,pcVar3)
                                ;
                                if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                                  return -0x2980;
                                }
                                p = p + -(long)n._4_4_;
                                register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                                if (0 < pmStack_38->max_pathlen) {
                                  n._4_4_ = snprintf(register0x00000000,(size_t)p,", max_pathlen=%d"
                                                     ,(ulong)(pmStack_38->max_pathlen - 1));
                                  if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                                    return -0x2980;
                                  }
                                  p = p + -(long)n._4_4_;
                                  register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                                }
                              }
                              if ((pmStack_38->ext_types & 0x20U) != 0) {
                                n._4_4_ = snprintf(stack0xffffffffffffffb0,(size_t)p,
                                                   "\n%ssubject alt name  :",crt_local);
                                if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                                  return -0x2980;
                                }
                                p = p + -(long)n._4_4_;
                                register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                                iVar2 = mbedtls_x509_info_subject_alt_name
                                                  ((char **)(key_size_str + 0x10),(size_t *)&p,
                                                   &pmStack_38->subject_alt_names,(char *)crt_local)
                                ;
                                if (iVar2 != 0) {
                                  return iVar2;
                                }
                                n._4_4_ = 0;
                              }
                              if ((pmStack_38->ext_types & 0x10000U) != 0) {
                                n._4_4_ = snprintf(stack0xffffffffffffffb0,(size_t)p,
                                                   "\n%scert. type        : ",crt_local);
                                if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                                  return -0x2980;
                                }
                                p = p + -(long)n._4_4_;
                                register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                                iVar2 = mbedtls_x509_info_cert_type
                                                  ((char **)(key_size_str + 0x10),(size_t *)&p,
                                                   pmStack_38->ns_cert_type);
                                if (iVar2 != 0) {
                                  return iVar2;
                                }
                                n._4_4_ = 0;
                              }
                              if ((pmStack_38->ext_types & 4U) != 0) {
                                n._4_4_ = snprintf(stack0xffffffffffffffb0,(size_t)p,
                                                   "\n%skey usage         : ",crt_local);
                                if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                                  return -0x2980;
                                }
                                p = p + -(long)n._4_4_;
                                register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                                iVar2 = mbedtls_x509_info_key_usage
                                                  ((char **)(key_size_str + 0x10),(size_t *)&p,
                                                   pmStack_38->key_usage);
                                if (iVar2 != 0) {
                                  return iVar2;
                                }
                                n._4_4_ = 0;
                              }
                              if ((pmStack_38->ext_types & 0x800U) != 0) {
                                n._4_4_ = snprintf(stack0xffffffffffffffb0,(size_t)p,
                                                   "\n%sext key usage     : ",crt_local);
                                if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                                  return -0x2980;
                                }
                                p = p + -(long)n._4_4_;
                                register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                                iVar2 = x509_info_ext_key_usage
                                                  ((char **)(key_size_str + 0x10),(size_t *)&p,
                                                   &pmStack_38->ext_key_usage);
                                if (iVar2 != 0) {
                                  return iVar2;
                                }
                                n._4_4_ = 0;
                              }
                              if ((pmStack_38->ext_types & 8U) != 0) {
                                n._4_4_ = snprintf(stack0xffffffffffffffb0,(size_t)p,
                                                   "\n%scertificate policies : ",crt_local);
                                if ((n._4_4_ < 0) || (p <= (char *)(long)n._4_4_)) {
                                  return -0x2980;
                                }
                                p = p + -(long)n._4_4_;
                                register0x00000000 = stack0xffffffffffffffb0 + n._4_4_;
                                iVar2 = x509_info_cert_policies
                                                  ((char **)(key_size_str + 0x10),(size_t *)&p,
                                                   &pmStack_38->certificate_policies);
                                if (iVar2 != 0) {
                                  return iVar2;
                                }
                                n._4_4_ = 0;
                              }
                              iVar2 = snprintf(stack0xffffffffffffffb0,(size_t)p,"\n");
                              if ((iVar2 < 0) || (p <= (char *)(long)iVar2)) {
                                buf_local._4_4_ = -0x2980;
                              }
                              else {
                                buf_local._4_4_ = (int)prefix_local - ((int)p - iVar2);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int mbedtls_x509_crt_info(char *buf, size_t size, const char *prefix,
                          const mbedtls_x509_crt *crt)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n;
    char *p;
    char key_size_str[BEFORE_COLON];

    p = buf;
    n = size;

    if (NULL == crt) {
        ret = mbedtls_snprintf(p, n, "\nCertificate is uninitialised!\n");
        MBEDTLS_X509_SAFE_SNPRINTF;

        return (int) (size - n);
    }

    ret = mbedtls_snprintf(p, n, "%scert. version     : %d\n",
                           prefix, crt->version);
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_snprintf(p, n, "%sserial number     : ",
                           prefix);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_serial_gets(p, n, &crt->serial);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%sissuer name       : ", prefix);
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets(p, n, &crt->issuer);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%ssubject name      : ", prefix);
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets(p, n, &crt->subject);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%sissued  on        : " \
                                 "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                           crt->valid_from.year, crt->valid_from.mon,
                           crt->valid_from.day,  crt->valid_from.hour,
                           crt->valid_from.min,  crt->valid_from.sec);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%sexpires on        : " \
                                 "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                           crt->valid_to.year, crt->valid_to.mon,
                           crt->valid_to.day,  crt->valid_to.hour,
                           crt->valid_to.min,  crt->valid_to.sec);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%ssigned using      : ", prefix);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets(p, n, &crt->sig_oid, crt->sig_pk,
                                    crt->sig_md, crt->sig_opts);
    MBEDTLS_X509_SAFE_SNPRINTF;

    /* Key size */
    if ((ret = mbedtls_x509_key_size_helper(key_size_str, BEFORE_COLON,
                                            mbedtls_pk_get_name(&crt->pk))) != 0) {
        return ret;
    }

    ret = mbedtls_snprintf(p, n, "\n%s%-" BC "s: %d bits", prefix, key_size_str,
                           (int) mbedtls_pk_get_bitlen(&crt->pk));
    MBEDTLS_X509_SAFE_SNPRINTF;

    /*
     * Optional extensions
     */

    if (crt->ext_types & MBEDTLS_X509_EXT_BASIC_CONSTRAINTS) {
        ret = mbedtls_snprintf(p, n, "\n%sbasic constraints : CA=%s", prefix,
                               crt->ca_istrue ? "true" : "false");
        MBEDTLS_X509_SAFE_SNPRINTF;

        if (crt->max_pathlen > 0) {
            ret = mbedtls_snprintf(p, n, ", max_pathlen=%d", crt->max_pathlen - 1);
            MBEDTLS_X509_SAFE_SNPRINTF;
        }
    }

    if (crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME) {
        ret = mbedtls_snprintf(p, n, "\n%ssubject alt name  :", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = mbedtls_x509_info_subject_alt_name(&p, &n,
                                                      &crt->subject_alt_names,
                                                      prefix)) != 0) {
            return ret;
        }
    }

    if (crt->ext_types & MBEDTLS_X509_EXT_NS_CERT_TYPE) {
        ret = mbedtls_snprintf(p, n, "\n%scert. type        : ", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = mbedtls_x509_info_cert_type(&p, &n, crt->ns_cert_type)) != 0) {
            return ret;
        }
    }

    if (crt->ext_types & MBEDTLS_X509_EXT_KEY_USAGE) {
        ret = mbedtls_snprintf(p, n, "\n%skey usage         : ", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = mbedtls_x509_info_key_usage(&p, &n, crt->key_usage)) != 0) {
            return ret;
        }
    }

    if (crt->ext_types & MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE) {
        ret = mbedtls_snprintf(p, n, "\n%sext key usage     : ", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = x509_info_ext_key_usage(&p, &n,
                                           &crt->ext_key_usage)) != 0) {
            return ret;
        }
    }

    if (crt->ext_types & MBEDTLS_OID_X509_EXT_CERTIFICATE_POLICIES) {
        ret = mbedtls_snprintf(p, n, "\n%scertificate policies : ", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = x509_info_cert_policies(&p, &n,
                                           &crt->certificate_policies)) != 0) {
            return ret;
        }
    }

    ret = mbedtls_snprintf(p, n, "\n");
    MBEDTLS_X509_SAFE_SNPRINTF;

    return (int) (size - n);
}